

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

char * tcg_get_arg_str(TCGContext_conflict9 *s,char *buf,int buf_size,TCGArg arg)

{
  undefined4 in_register_00000014;
  ulong *puVar1;
  char *__format;
  
  puVar1 = (ulong *)CONCAT44(in_register_00000014,buf_size);
  if ((*puVar1 >> 0x25 & 1) == 0) {
    if ((*puVar1 >> 0x26 & 1) == 0) {
      __format = "tmp%d";
    }
    else {
      __format = "loc%d";
    }
    snprintf(buf,0x80,__format,
             (ulong)(uint)((int)((long)puVar1 + (-0x388 - (long)s) >> 3) * -0x49249249 -
                          s->nb_globals));
  }
  else {
    pstrcpy(buf,0x80,(char *)puVar1[4]);
  }
  return buf;
}

Assistant:

static char *tcg_get_arg_str(TCGContext *s, char *buf,
                             int buf_size, TCGArg arg)
{
    return tcg_get_arg_str_ptr(s, buf, buf_size, arg_temp(arg));
}